

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addReporter(Catch *this,Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  int iVar1;
  type tVar2;
  IStreamingReporter *pIVar3;
  undefined4 extraout_var;
  MultipleReporters *this_00;
  Ptr<Catch::IStreamingReporter> local_48;
  MultipleReporters *local_40;
  MultipleReporters *multi;
  undefined1 local_21;
  Ptr<Catch::IStreamingReporter> *local_20;
  Ptr<Catch::IStreamingReporter> *additionalReporter_local;
  Ptr<Catch::IStreamingReporter> *existingReporter_local;
  Ptr<Catch::IStreamingReporter> *resultingReporter;
  
  local_21 = 0;
  local_20 = additionalReporter;
  additionalReporter_local = existingReporter;
  existingReporter_local = (Ptr<Catch::IStreamingReporter> *)this;
  Ptr<Catch::IStreamingReporter>::Ptr((Ptr<Catch::IStreamingReporter> *)this);
  tVar2 = Ptr::operator_cast_to_function_pointer((Ptr *)additionalReporter_local);
  if (tVar2 == 0) {
    Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,local_20);
  }
  else {
    pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(additionalReporter_local);
    iVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    local_40 = (MultipleReporters *)CONCAT44(extraout_var,iVar1);
    if (local_40 == (MultipleReporters *)0x0) {
      this_00 = (MultipleReporters *)operator_new(0x28);
      MultipleReporters::MultipleReporters(this_00);
      local_40 = this_00;
      Ptr<Catch::IStreamingReporter>::Ptr(&local_48,(IStreamingReporter *)this_00);
      Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,&local_48);
      Ptr<Catch::IStreamingReporter>::~Ptr(&local_48);
      tVar2 = Ptr::operator_cast_to_function_pointer((Ptr *)additionalReporter_local);
      if (tVar2 != 0) {
        MultipleReporters::add(local_40,additionalReporter_local);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=
                ((Ptr<Catch::IStreamingReporter> *)this,additionalReporter_local);
    }
    MultipleReporters::add(local_40,local_20);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = existingReporter->tryAsMulti();
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}